

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

int Curl_removeHandleFromPipeline(Curl_easy *handle,curl_llist *pipeline)

{
  curl_llist_element *e;
  
  if (pipeline != (curl_llist *)0x0) {
    for (e = pipeline->head; e != (curl_llist_element *)0x0; e = e->next) {
      if ((Curl_easy *)e->ptr == handle) {
        Curl_llist_remove(pipeline,e,(void *)0x0);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int Curl_removeHandleFromPipeline(struct Curl_easy *handle,
                                  struct curl_llist *pipeline)
{
  if(pipeline) {
    struct curl_llist_element *curr;

    curr = pipeline->head;
    while(curr) {
      if(curr->ptr == handle) {
        Curl_llist_remove(pipeline, curr, NULL);
        return 1; /* we removed a handle */
      }
      curr = curr->next;
    }
  }

  return 0;
}